

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void make_corpse(CHAR_DATA *killer,CHAR_DATA *ch)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  CHAR_DATA *in_RSI;
  __type_conflict2 _Var7;
  OBJ_DATA *in_next;
  OBJ_DATA *in;
  bool floating;
  OBJ_AFFECT_DATA oaf;
  char *name;
  OBJ_DATA *obj_next;
  OBJ_DATA *obj;
  OBJ_DATA *corpse;
  char buf [4608];
  undefined4 in_stack_ffffffffffffed18;
  int in_stack_ffffffffffffed1c;
  OBJ_DATA *in_stack_ffffffffffffed20;
  CHAR_DATA *in_stack_ffffffffffffed28;
  char *in_stack_ffffffffffffed30;
  OBJ_DATA *in_stack_ffffffffffffed40;
  char *in_stack_ffffffffffffed48;
  ulong in_stack_ffffffffffffed50;
  int in_stack_ffffffffffffed58;
  CHAR_DATA *in_stack_ffffffffffffed60;
  OBJ_DATA *in_stack_ffffffffffffed68;
  CHAR_DATA *obj_00;
  undefined7 in_stack_ffffffffffffed70;
  byte bVar8;
  OBJ_INDEX_DATA *in_stack_ffffffffffffedd0;
  OBJ_DATA *pOVar9;
  OBJ_DATA *local_1228;
  OBJ_DATA *local_1220;
  char local_1218 [4428];
  int in_stack_ffffffffffffff34;
  
  bVar2 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
  iVar3 = (int)((ulong)in_stack_ffffffffffffed28 >> 0x20);
  if (bVar2) {
    pcVar6 = in_RSI->short_descr;
    get_obj_index(iVar3);
    local_1220 = create_object(in_stack_ffffffffffffedd0,(int)((ulong)pcVar6 >> 0x20));
    iVar3 = number_range((int)in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
    local_1220->timer = (short)iVar3;
    bVar2 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
    if (bVar2) {
      pcVar5 = palloc_string(in_stack_ffffffffffffed48);
      local_1220->talked = pcVar5;
    }
    else {
      pcVar5 = palloc_string(in_stack_ffffffffffffed48);
      local_1220->talked = pcVar5;
    }
    if (0 < in_RSI->gold) {
      create_money(in_stack_ffffffffffffff34);
      obj_to_obj(in_stack_ffffffffffffed20,
                 (OBJ_DATA *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
      in_RSI->gold = 0;
    }
    local_1220->cost = 0;
    local_1220->mob_vnum = (int)in_RSI->pIndexData->vnum;
  }
  else {
    pcVar6 = in_RSI->name;
    get_obj_index(iVar3);
    local_1220 = create_object(in_stack_ffffffffffffedd0,(int)((ulong)pcVar6 >> 0x20));
    iVar3 = number_range((int)in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
    local_1220->timer = (short)iVar3;
    if ((in_RSI->in_room != (ROOM_INDEX_DATA *)0x0) &&
       (bVar2 = is_explore((ROOM_INDEX_DATA *)in_stack_ffffffffffffed28), bVar2)) {
      iVar3 = number_range((int)in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
      local_1220->timer = (short)iVar3;
    }
    local_1220->value[4] = in_RSI->hometown;
    bVar2 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
    if (bVar2) {
      pcVar5 = palloc_string(in_stack_ffffffffffffed48);
      local_1220->talked = pcVar5;
    }
    else {
      pcVar5 = palloc_string(in_stack_ffffffffffffed48);
      local_1220->talked = pcVar5;
    }
    pcVar5 = palloc_string(in_stack_ffffffffffffed48);
    local_1220->owner = pcVar5;
    if (1 < in_RSI->gold) {
      create_money(in_stack_ffffffffffffff34);
      obj_to_obj(in_stack_ffffffffffffed20,
                 (OBJ_DATA *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
      in_RSI->gold = 0;
    }
    local_1220->cost = 0;
  }
  if (in_RSI->level < 1) {
    iVar3 = 1;
  }
  else if (in_RSI->level < 0x65) {
    in_stack_ffffffffffffed58 = (int)in_RSI->level;
    iVar3 = in_stack_ffffffffffffed58;
  }
  else {
    in_stack_ffffffffffffed58 = 100;
    iVar3 = in_stack_ffffffffffffed58;
  }
  local_1220->level = (short)iVar3;
  bVar2 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
  if (bVar2) {
    in_stack_ffffffffffffed50 = in_RSI->act[0];
    _Var7 = std::pow<int,int>(0,0x5e4dec);
    if ((in_stack_ffffffffffffed50 & (long)_Var7) == 0) {
      in_stack_ffffffffffffed48 = (char *)in_RSI->form[0];
      _Var7 = std::pow<int,int>(0,0x5e4e22);
      if (((ulong)in_stack_ffffffffffffed48 & (long)_Var7) == 0) goto LAB_005e4e5f;
    }
    _Var7 = std::pow<int,int>(0,0x5e4e44);
    local_1220->extra_flags[0] = (long)_Var7 | local_1220->extra_flags[0];
  }
LAB_005e4e5f:
  local_1220->value[2] = (int)in_RSI->size;
  sprintf(local_1218,local_1220->short_descr,pcVar6);
  free_pstring((char *)in_stack_ffffffffffffed20);
  pcVar5 = palloc_string(in_stack_ffffffffffffed48);
  local_1220->short_descr = pcVar5;
  sprintf(local_1218,local_1220->description,pcVar6);
  free_pstring((char *)in_stack_ffffffffffffed20);
  pcVar6 = palloc_string(in_stack_ffffffffffffed48);
  local_1220->description = pcVar6;
  local_1220->ohp = (int)in_RSI->max_hit;
  pOVar9 = in_RSI->carrying;
LAB_005e4f62:
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          do {
            local_1228 = pOVar9;
            if (local_1228 == (OBJ_DATA *)0x0) {
              obj_to_room(local_1220,in_RSI->in_room);
              bVar2 = is_affected(in_RSI,(int)gsn_noxious_ward);
              if (bVar2) {
                act(in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,in_stack_ffffffffffffed20,
                    (void *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18),0);
                act(in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,in_stack_ffffffffffffed20,
                    (void *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18),0);
                init_affect_obj((OBJ_AFFECT_DATA *)0x5e54aa);
                affect_to_obj(in_stack_ffffffffffffed20,
                              (OBJ_AFFECT_DATA *)
                              CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
              }
              bVar2 = is_affected(in_RSI,(int)gsn_ultradiffusion);
              if (bVar2) {
                extract_obj(in_stack_ffffffffffffed40);
              }
              return;
            }
            bVar8 = 0;
            pOVar9 = local_1228->next_content;
            in_stack_ffffffffffffed40 = (OBJ_DATA *)local_1228->extra_flags[0];
            _Var7 = std::pow<int,int>(0,0x5e4fad);
          } while (((ulong)in_stack_ffffffffffffed40 & (long)_Var7) != 0);
          bVar2 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18))
          ;
          if ((bVar2) ||
             (uVar1 = local_1228->extra_flags[0], _Var7 = std::pow<int,int>(0,0x5e4ff9),
             (uVar1 & (long)_Var7) == 0)) break;
          unequip_char(in_stack_ffffffffffffed60,
                       (OBJ_DATA *)CONCAT44(iVar3,in_stack_ffffffffffffed58),
                       SUB81(in_stack_ffffffffffffed50 >> 0x38,0));
          equip_char((CHAR_DATA *)CONCAT17(bVar8,in_stack_ffffffffffffed70),
                     in_stack_ffffffffffffed68,(int)((ulong)in_stack_ffffffffffffed60 >> 0x20),
                     SUB81((ulong)in_stack_ffffffffffffed60 >> 0x18,0));
        }
        obj_from_char(in_stack_ffffffffffffed40);
        if (local_1228->item_type == 10) {
          iVar4 = number_range((int)in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
          local_1228->timer = (short)iVar4;
        }
        if (local_1228->item_type == 2) {
          iVar4 = number_range((int)in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
          local_1228->timer = (short)iVar4;
        }
        in_stack_ffffffffffffed30 = (char *)local_1228->extra_flags[0];
        _Var7 = std::pow<int,int>(0,0x5e50e8);
        if ((((ulong)in_stack_ffffffffffffed30 & (long)_Var7) != 0) && ((bVar8 & 1) == 0)) {
          local_1228->timer = 1;
          _Var7 = std::pow<int,int>(0,0x5e5122);
          local_1228->extra_flags[0] =
               ((long)_Var7 ^ 0xffffffffffffffffU) & local_1228->extra_flags[0];
        }
        if ((0 < local_1228->pIndexData->start_timer) &&
           (bVar2 = is_npc((CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18)), bVar2)) {
          local_1228->timer = local_1228->pIndexData->start_timer;
        }
        _Var7 = std::pow<int,int>(0,0x5e519d);
        local_1228->extra_flags[0] =
             ((long)_Var7 ^ 0xffffffffffffffffU) & local_1228->extra_flags[0];
        if ((local_1228->pIndexData->limcount <= local_1228->pIndexData->limtotal) ||
           (local_1228->pIndexData->limtotal < 1)) break;
        act(in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,in_stack_ffffffffffffed20,
            (void *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18),0);
        extract_obj(in_stack_ffffffffffffed40);
      }
      if ((bVar8 & 1) == 0) break;
      if ((local_1228 == (OBJ_DATA *)0x0) ||
         (bVar2 = is_obj_stat((OBJ_DATA *)in_stack_ffffffffffffed28,
                              (int)((ulong)in_stack_ffffffffffffed20 >> 0x20)), !bVar2)) {
        act(in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,in_stack_ffffffffffffed20,
            (void *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18),0);
        obj_to_room(local_1228,in_RSI->in_room);
      }
      else {
        if (local_1228->contains == (OBJ_DATA *)0x0) {
          act(in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,in_stack_ffffffffffffed20,
              (void *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18),0);
        }
        else {
          act(in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,in_stack_ffffffffffffed20,
              (void *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18),0);
          obj_00 = (CHAR_DATA *)local_1228->contains;
          while (obj_00 != (CHAR_DATA *)0x0) {
            in_stack_ffffffffffffed60 = obj_00->next_in_room;
            obj_from_obj(in_stack_ffffffffffffed40);
            obj_to_room((OBJ_DATA *)obj_00,in_RSI->in_room);
            obj_00 = in_stack_ffffffffffffed60;
          }
          in_stack_ffffffffffffed68 = (OBJ_DATA *)0x0;
        }
        extract_obj(in_stack_ffffffffffffed40);
      }
    }
    in_stack_ffffffffffffed28 = (CHAR_DATA *)local_1228->extra_flags[0];
    _Var7 = std::pow<int,int>(0,0x5e538b);
  } while (((ulong)in_stack_ffffffffffffed28 & (long)_Var7) != 0);
  bVar2 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
  if (!bVar2) goto code_r0x005e53b1;
  goto LAB_005e53e9;
code_r0x005e53b1:
  in_stack_ffffffffffffed20 = (OBJ_DATA *)local_1228->extra_flags[0];
  _Var7 = std::pow<int,int>(0,0x5e53d4);
  if (((ulong)in_stack_ffffffffffffed20 & (long)_Var7) == 0) {
LAB_005e53e9:
    obj_to_obj(in_stack_ffffffffffffed20,
               (OBJ_DATA *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
  }
  goto LAB_005e4f62;
}

Assistant:

void make_corpse(CHAR_DATA *killer, CHAR_DATA *ch)
{
	char buf[MAX_STRING_LENGTH];
	OBJ_DATA *corpse;
	OBJ_DATA *obj;
	OBJ_DATA *obj_next;
	char *name;
	OBJ_AFFECT_DATA oaf;

	if (is_npc(ch))
	{
		name = ch->short_descr;
		corpse = create_object(get_obj_index(OBJ_VNUM_CORPSE_NPC), 0);
		corpse->timer = number_range(5, 8);
		// free_pstring(corpse->talked);

		if (is_npc(killer))
			corpse->talked = palloc_string(killer->short_descr);
		else
			corpse->talked = palloc_string(killer->true_name);

		if (ch->gold > 0)
		{
			obj_to_obj(create_money(ch->gold), corpse);
			ch->gold = 0;
		}

		corpse->cost = 0;
		corpse->mob_vnum = ch->pIndexData->vnum;
	}
	else
	{
		name = ch->name;
		corpse = create_object(get_obj_index(OBJ_VNUM_CORPSE_PC), 0);
		corpse->timer = number_range(20, 35);

		if (ch->in_room && is_explore(ch->in_room))
			corpse->timer = number_range(6, 9);

		corpse->value[4] = ch->hometown;

		// free_pstring(corpse->talked);
		if (is_npc(killer))
			corpse->talked = palloc_string(killer->short_descr);
		else
			corpse->talked = palloc_string(killer->true_name);

		corpse->owner = palloc_string(ch->true_name);

		if (ch->gold > 1)
		{
			obj_to_obj(create_money(ch->gold), corpse);
			ch->gold = 0;
		}

		corpse->cost = 0;
	}

	corpse->level = URANGE(1, ch->level, 100);

	if (is_npc(ch) && (IS_SET(ch->act, ACT_UNDEAD) || IS_SET(ch->form, FORM_UNDEAD)))
		SET_BIT(corpse->extra_flags, CORPSE_NO_ANIMATE);

	corpse->value[2] = ch->size;

	sprintf(buf, corpse->short_descr, name);
	free_pstring(corpse->short_descr);
	corpse->short_descr = palloc_string(buf);

	sprintf(buf, corpse->description, name);
	free_pstring(corpse->description);
	corpse->description = palloc_string(buf);
	corpse->ohp = ch->max_hit;
	for (obj = ch->carrying; obj != nullptr; obj = obj_next)
	{
		bool floating = false;

		obj_next = obj->next_content;
		if (IS_SET(obj->extra_flags, ITEM_BRAND))
			continue;

		if (!is_npc(ch) && IS_SET(obj->extra_flags, ITEM_FIXED))
		{
			unequip_char(ch, obj, false);
			equip_char(ch, obj, obj->wear_loc, false);
			continue;
		}

		obj_from_char(obj);

		if (obj->item_type == ITEM_POTION)
			obj->timer = number_range(500, 1000);

		if (obj->item_type == ITEM_SCROLL)
			obj->timer = number_range(1000, 2500);

		if (IS_SET(obj->extra_flags, ITEM_ROT_DEATH) && !floating)
		{
			obj->timer = 1;
			REMOVE_BIT(obj->extra_flags, ITEM_ROT_DEATH);
		}

		if (obj->pIndexData->start_timer > 0 && is_npc(ch))
			obj->timer = obj->pIndexData->start_timer;

		REMOVE_BIT(obj->extra_flags, ITEM_VIS_DEATH);

		if (obj->pIndexData->limcount > obj->pIndexData->limtotal && obj->pIndexData->limtotal > 0)
		{
			act("$p flashes brightly and vaporizes.", ch, obj, nullptr, TO_ROOM);
			extract_obj(obj);
			continue;
		}
		else if (floating)
		{
			if (obj != nullptr && is_obj_stat(obj, ITEM_ROT_DEATH)) /* get rid of it! */
			{
				if (obj->contains != nullptr)
				{
					OBJ_DATA *in, *in_next;

					act("$p evaporates, scattering its contents.", ch, obj, nullptr, TO_ROOM);

					for (in = obj->contains; in != nullptr; in = in_next)
					{
						in_next = in->next_content;
						obj_from_obj(in);
						obj_to_room(in, ch->in_room);
					}
				}
				else
				{
					act("$p evaporates.", ch, obj, nullptr, TO_ROOM);
				}

				extract_obj(obj);
			}
			else
			{
				act("$p falls to the floor.", ch, obj, nullptr, TO_ROOM);
				obj_to_room(obj, ch->in_room);
			}
		}
		//	else if (obj->wear_loc == WEAR_BRAND)
		else if (IS_SET(obj->extra_flags, ITEM_BRAND))
		{
			/* nothing */
		}
		else if (!is_npc(ch) && IS_SET(obj->extra_flags, ITEM_FIXED))
		{
			/* nothing */
		}
		else
		{
			obj_to_obj(obj, corpse);
		}
	}
	obj_to_room(corpse, ch->in_room);

	if (is_affected(ch, gsn_noxious_ward))
	{
		act("A cloud of thick smoke billows out of your corpse!", ch, corpse, nullptr, TO_CHAR);
		act("A cloud of thick smoke billows out of $p!", ch, corpse, nullptr, TO_ROOM);
		init_affect_obj(&oaf);
		oaf.where = TO_OBJ_AFFECTS;
		oaf.type = gsn_noxious_ward;
		oaf.duration = -1;
		affect_to_obj(corpse, &oaf);
	}

	if (is_affected(ch, gsn_ultradiffusion))
		extract_obj(corpse);
}